

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World_3df.cpp
# Opt level: O3

double __thiscall World_3df::Evaluate_fitness(World_3df *this,size_t genno)

{
  creat_t *pcVar1;
  ostream *poVar2;
  double extraout_XMM0_Qa;
  Msg local_2d8;
  Msg local_2a8;
  Msg local_278;
  Msg local_248;
  Msg local_218;
  Msg local_1e8;
  Msg local_1b8;
  Msg local_188;
  Msg local_158;
  double local_128;
  string local_120;
  element_type *local_100;
  size_t local_f8;
  World_3df *local_f0;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  pointer local_48;
  double local_40;
  long local_38;
  
  local_48 = (this->super_World).pops.
             super__Vector_base<boost::shared_ptr<Population>,_std::allocator<boost::shared_ptr<Population>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (local_48 ==
      (this->super_World).pops.
      super__Vector_base<boost::shared_ptr<Population>,_std::allocator<boost::shared_ptr<Population>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_128 = 0.0;
  }
  else {
    local_128 = 0.0;
    local_38 = 0;
    local_f8 = genno;
    local_f0 = this;
    do {
      if (local_48->px == (element_type *)0x0) {
LAB_00110b89:
        __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,
                      "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<Population>::operator->() const [T = Population]"
                     );
      }
      (*local_48->px->_vptr_Population[6])();
      local_120._M_dataplus._M_p = (pointer)(local_f0->super_World).LOGFILE.px;
      local_120._M_string_length = (size_type)(local_f0->super_World).LOGFILE.pn.pi_;
      if ((sp_counted_base *)local_120._M_string_length != (sp_counted_base *)0x0) {
        LOCK();
        ((sp_counted_base *)local_120._M_string_length)->use_count_ =
             ((sp_counted_base *)local_120._M_string_length)->use_count_ + 1;
        UNLOCK();
      }
      local_100 = (element_type *)local_120._M_dataplus._M_p;
      if ((element_type *)local_120._M_dataplus._M_p == (element_type *)0x0) {
        __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d2,
                      "typename boost::detail::sp_dereference<T>::type boost::shared_ptr<util::logging::File_logger>::operator*() const [T = util::logging::File_logger]"
                     );
      }
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      local_40 = extraout_XMM0_Qa;
      std::__cxx11::string::_M_construct((ulong)&local_e8,'\x0f');
      util::logging::Msg::Msg(&local_2a8,&local_e8,L_NORM);
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"[","");
      util::logging::Msg::operator+(&local_1e8,&local_2a8,&local_c8);
      util::logging::Msg::operator+(&local_158,&local_1e8,local_f8);
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,"]: Fitnes populacji nr ","");
      util::logging::Msg::operator+(&local_218,&local_158,&local_a8);
      util::logging::Msg::operator+(&local_2d8,&local_218,local_38);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88," (","");
      util::logging::Msg::operator+(&local_188,&local_2d8,&local_88);
      if (local_48->px == (Population *)0x0) goto LAB_00110b89;
      pcVar1 = Population::get_creatures(local_48->px);
      util::logging::Msg::operator+
                (&local_1b8,&local_188,
                 (long)(pcVar1->
                       super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pcVar1->
                       super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 4);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,")  = ","");
      util::logging::Msg::operator+(&local_248,&local_1b8,&local_68);
      util::logging::Msg::operator+(&local_278,&local_248,local_40);
      (**(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)&local_100->super_Ostream_logger)->_M_allocated_capacity + 0x18))
                (local_100,&local_278);
      util::logging::Msg::~Msg(&local_278);
      util::logging::Msg::~Msg(&local_248);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      util::logging::Msg::~Msg(&local_1b8);
      util::logging::Msg::~Msg(&local_188);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      util::logging::Msg::~Msg(&local_2d8);
      util::logging::Msg::~Msg(&local_218);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
      util::logging::Msg::~Msg(&local_158);
      util::logging::Msg::~Msg(&local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      util::logging::Msg::~Msg(&local_2a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      boost::detail::shared_count::~shared_count((shared_count *)&local_120._M_string_length);
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_c8,'\x0f');
      util::logging::Msg::Msg(&local_2a8,&local_c8,L_NORM);
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"[","");
      util::logging::Msg::operator+(&local_1e8,&local_2a8,&local_a8);
      util::logging::Msg::operator+(&local_158,&local_1e8,local_f8);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"]: Fitnes populacji nr ","");
      util::logging::Msg::operator+(&local_218,&local_158,&local_88);
      util::logging::Msg::operator+(&local_2d8,&local_218,local_38);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68," (","");
      util::logging::Msg::operator+(&local_188,&local_2d8,&local_68);
      if (local_48->px == (Population *)0x0) goto LAB_00110b89;
      pcVar1 = Population::get_creatures(local_48->px);
      util::logging::Msg::operator+
                (&local_1b8,&local_188,
                 (long)(pcVar1->
                       super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pcVar1->
                       super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 4);
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,")  = ","");
      util::logging::Msg::operator+(&local_248,&local_1b8,&local_120);
      util::logging::Msg::operator+(&local_278,&local_248,local_40);
      util::logging::Msg::getMsg_txt_abi_cxx11_(&local_e8,&local_278);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_e8._M_dataplus._M_p,local_e8._M_string_length)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      util::logging::Msg::~Msg(&local_278);
      util::logging::Msg::~Msg(&local_248);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p);
      }
      util::logging::Msg::~Msg(&local_1b8);
      util::logging::Msg::~Msg(&local_188);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      util::logging::Msg::~Msg(&local_2d8);
      util::logging::Msg::~Msg(&local_218);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      util::logging::Msg::~Msg(&local_158);
      util::logging::Msg::~Msg(&local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
      util::logging::Msg::~Msg(&local_2a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      local_38 = local_38 + 1;
      local_128 = local_128 + local_40;
      local_48 = local_48 + 1;
    } while (local_48 !=
             (local_f0->super_World).pops.
             super__Vector_base<boost::shared_ptr<Population>,_std::allocator<boost::shared_ptr<Population>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  return local_128;
}

Assistant:

double World_3df::Evaluate_fitness( size_t genno )
{
	double ret = 0, tmp = 0;
	size_t ctr = 0;
	for(pop_t::iterator it = pops.begin(); it != pops.end(); ++it)
	{
		tmp = (*it)->Evaluate_fitness();

		(*get_log()) << util::logging::Msg(std::string(15, '-')) + "[" + static_cast<long long> (genno)
				+ "]: Fitnes populacji nr " + static_cast<long long> (ctr) + " ("
				+ static_cast<long long> ((*it)->get_creatures().size()) + ")  = " + tmp;

		std::cout << (util::logging::Msg(std::string(15, '-')) + "[" + static_cast<long long> (genno)
				+ "]: Fitnes populacji nr " + static_cast<long long> (ctr) + " ("
				+ static_cast<long long> ((*it)->get_creatures().size()) + ")  = " + tmp).getMsg_txt() << std::endl;

		ctr++;
		ret += tmp;

	}

	return ret;

}